

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharedRenderingPerfTests.cpp
# Opt level: O0

void deqp::egl::anon_unknown_0::anon_unknown_5::createTextureData
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *data,TestConfig *config)

{
  value_type_conflict2 local_24;
  value_type_conflict2 local_23;
  value_type_conflict2 local_22;
  value_type_conflict2 local_21;
  int local_20;
  int local_1c;
  int y;
  int x;
  TestConfig *config_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data_local;
  
  _y = config;
  config_local = (TestConfig *)data;
  for (local_1c = 0; local_1c < _y->textureWidth; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < _y->textureHeight; local_20 = local_20 + 1) {
      local_21 = (value_type_conflict2)((local_1c * 0xff) / 0xff);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)config_local,&local_21);
      local_22 = (value_type_conflict2)((local_20 * 0xff) / 0xff);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)config_local,&local_22);
      local_23 = (value_type_conflict2)((local_1c * 0xff * local_20) / 0xfe01);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)config_local,&local_23);
      local_24 = 0xff;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)config_local,&local_24);
    }
  }
  return;
}

Assistant:

void createTextureData (vector<deUint8>& data, const TestConfig& config)
{
	for (int x = 0; x < config.textureWidth; x++)
	{
		for (int y = 0; y < config.textureHeight; y++)
		{
			data.push_back((deUint8)((255*x)/255));
			data.push_back((deUint8)((255*y)/255));
			data.push_back((deUint8)((255*x*y)/(255*255)));
			data.push_back(255);
		}
	}
}